

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scomplex.c
# Opt level: O3

singlecomplex c_sqrt(singlecomplex *z)

{
  float fVar1;
  singlecomplex sVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = z->r;
  fVar1 = z->i;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar4 = (SQRT(fVar3 * fVar3 + fVar1 * fVar1) - fVar3) * 0.5;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar3 = fVar1 / (fVar4 + fVar4);
  }
  else {
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    fVar4 = 0.0;
  }
  sVar2.i = fVar4;
  sVar2.r = fVar3;
  return sVar2;
}

Assistant:

singlecomplex c_sqrt(singlecomplex *z)
{
    singlecomplex retval;
    register float cr, ci, real, imag;

    real = z->r;
    imag = z->i;

    if ( imag == 0.0 ) {
        retval.r = sqrt(real);
        retval.i = 0.0;
    } else {
        ci = (sqrt(real*real + imag*imag) - real) / 2.0;
        ci = sqrt(ci);
        cr = imag / (2.0 * ci);
        retval.r = cr;
        retval.i = ci;
    }

    return retval;
}